

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_mmu.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_292896::MmuTest_set_membanks_Test::TestBody(MmuTest_set_membanks_Test *this)

{
  type pMVar1;
  MockSpec<void_(unsigned_short,_unsigned_char)> *this_00;
  MockSpec<bool_(unsigned_short)> *this_01;
  TypedExpectation<bool_(unsigned_short)> *this_02;
  pointer pIVar2;
  vector<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
  local_138;
  undefined1 local_120 [8];
  MemBankList mem_banks;
  Action<bool_(unsigned_short)> local_f8;
  WithoutMatchers local_d1;
  Matcher<unsigned_short> local_d0;
  MockSpec<bool_(unsigned_short)> local_b8;
  WithoutMatchers local_91;
  Matcher<unsigned_char> local_90;
  Matcher<unsigned_short> local_78;
  MockSpec<void_(unsigned_short,_unsigned_char)> local_50;
  unique_ptr<n_e_s::core::test::MockMemBank,_std::default_delete<n_e_s::core::test::MockMemBank>_>
  local_18;
  __single_object mem_bank;
  MmuTest_set_membanks_Test *this_local;
  
  mem_bank._M_t.
  super___uniq_ptr_impl<n_e_s::core::test::MockMemBank,_std::default_delete<n_e_s::core::test::MockMemBank>_>
  ._M_t.
  super__Tuple_impl<0UL,_n_e_s::core::test::MockMemBank_*,_std::default_delete<n_e_s::core::test::MockMemBank>_>
  .super__Head_base<0UL,_n_e_s::core::test::MockMemBank_*,_false>._M_head_impl =
       (__uniq_ptr_data<n_e_s::core::test::MockMemBank,_std::default_delete<n_e_s::core::test::MockMemBank>,_true,_true>
        )(__uniq_ptr_data<n_e_s::core::test::MockMemBank,_std::default_delete<n_e_s::core::test::MockMemBank>,_true,_true>
          )this;
  std::make_unique<n_e_s::core::test::MockMemBank>();
  pMVar1 = std::
           unique_ptr<n_e_s::core::test::MockMemBank,_std::default_delete<n_e_s::core::test::MockMemBank>_>
           ::operator*(&local_18);
  testing::Matcher<unsigned_short>::Matcher(&local_78,0x4d2);
  testing::Matcher<unsigned_char>::Matcher(&local_90,'*');
  n_e_s::core::test::MockMemBank::gmock_write_byte(&local_50,pMVar1,&local_78,&local_90);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::MockSpec<void_(unsigned_short,_unsigned_char)>::operator()
                      (&local_50,&local_91,(void *)0x0);
  testing::internal::MockSpec<void_(unsigned_short,_unsigned_char)>::InternalExpectedAt
            (this_00,
             "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_mmu.cpp"
             ,0x5f,"*mem_bank","write_byte(1234u, 42u)");
  testing::internal::MockSpec<void_(unsigned_short,_unsigned_char)>::~MockSpec(&local_50);
  testing::Matcher<unsigned_char>::~Matcher(&local_90);
  testing::Matcher<unsigned_short>::~Matcher(&local_78);
  pMVar1 = std::
           unique_ptr<n_e_s::core::test::MockMemBank,_std::default_delete<n_e_s::core::test::MockMemBank>_>
           ::operator*(&local_18);
  testing::Matcher<unsigned_short>::Matcher(&local_d0,0x4d2);
  n_e_s::core::test::MockMemBank::gmock_is_address_in_range(&local_b8,pMVar1,&local_d0);
  testing::internal::GetWithoutMatchers();
  this_01 = testing::internal::MockSpec<bool_(unsigned_short)>::operator()
                      (&local_b8,&local_d1,(void *)0x0);
  this_02 = testing::internal::MockSpec<bool_(unsigned_short)>::InternalExpectedAt
                      (this_01,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_mmu.cpp"
                       ,0x60,"*mem_bank","is_address_in_range(1234u)");
  testing::Return<bool>
            ((testing *)
             &mem_banks.
              super__Vector_base<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,true);
  testing::internal::ReturnAction::operator_cast_to_Action
            (&local_f8,
             (ReturnAction *)
             &mem_banks.
              super__Vector_base<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  testing::internal::TypedExpectation<bool_(unsigned_short)>::WillOnce(this_02,&local_f8);
  testing::Action<bool_(unsigned_short)>::~Action(&local_f8);
  testing::internal::ReturnAction<bool>::~ReturnAction
            ((ReturnAction<bool> *)
             &mem_banks.
              super__Vector_base<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  testing::internal::MockSpec<bool_(unsigned_short)>::~MockSpec(&local_b8);
  testing::Matcher<unsigned_short>::~Matcher(&local_d0);
  std::
  vector<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
  ::vector((vector<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
            *)local_120);
  std::
  vector<std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>,std::allocator<std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>>>
  ::
  emplace_back<std::unique_ptr<n_e_s::core::test::MockMemBank,std::default_delete<n_e_s::core::test::MockMemBank>>>
            ((vector<std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>,std::allocator<std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>>>
              *)local_120,&local_18);
  pIVar2 = std::unique_ptr<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>::operator->
                     (&(this->super_MmuTest).mmu);
  std::
  vector<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
  ::vector(&local_138,
           (vector<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
            *)local_120);
  (*pIVar2->_vptr_IMmu[2])(pIVar2,&local_138);
  std::
  vector<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
  ::~vector(&local_138);
  pIVar2 = std::unique_ptr<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>::operator->
                     (&(this->super_MmuTest).mmu);
  (*pIVar2->_vptr_IMmu[4])(pIVar2,0x4d2,0x2a);
  std::
  vector<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
  ::~vector((vector<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
             *)local_120);
  std::
  unique_ptr<n_e_s::core::test::MockMemBank,_std::default_delete<n_e_s::core::test::MockMemBank>_>::
  ~unique_ptr(&local_18);
  return;
}

Assistant:

TEST_F(MmuTest, set_membanks) {
    auto mem_bank = std::make_unique<MockMemBank>();

    EXPECT_CALL(*mem_bank, write_byte(1234u, 42u));
    EXPECT_CALL(*mem_bank, is_address_in_range(1234u))
            .WillOnce(testing::Return(true));

    MemBankList mem_banks;
    mem_banks.emplace_back(std::move(mem_bank));
    mmu->set_mem_banks(std::move(mem_banks));

    mmu->write_byte(1234u, 42u);
}